

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O1

int ipcmd_open_msq(ipcmd_t *ipcmd,int key,int creat)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = msgget(key,(uint)(creat != 0) << 9 | 0x1b6);
  ipcmd->socket = iVar1;
  ipcmd->send = ipcmd_send;
  ipcmd->recv = ipcmd_recv;
  ipcmd->flush = ipcmd_flush;
  if (iVar1 == -1) {
    ipcmd->connection_error = 1;
    iVar1 = -1;
  }
  else {
    uVar2 = getpid();
    uVar2 = uVar2 & 0x7fff;
    iVar1 = 1;
    if (creat != 0) {
      uVar2 = 1;
    }
    ipcmd->pid = uVar2;
    ipcmd->connection_error = 0;
    ipcmd->send = ipcmd_send_msq;
    ipcmd->recv = ipcmd_recv_msq;
    ipcmd->flush = ipcmd_flush_msq;
    ipcmd->type = IPCMD_MSQ;
  }
  return iVar1;
}

Assistant:

int ipcmd_open_msq(struct ipcmd_t* ipcmd, int key, int creat)
{
  if (creat)
    creat = IPC_CREAT;
  /* メッセージ・キューのオープン */
  ipcmd->socket = msgget(key, 0666 | creat);

  ipcmd->send = ipcmd_send;
  ipcmd->recv = ipcmd_recv;
  ipcmd->flush = ipcmd_flush;
  if (ipcmd->socket == -1)
  {
    ipcmd->connection_error = 1;
    return -1;
  }

  /* 内部データの初期化 */
  ipcmd->pid = 0x07fff & getpid();
  if (creat)
    ipcmd->pid = YPSPUR_MSG_CMD;
  ipcmd->connection_error = 0;
  ipcmd->send = ipcmd_send_msq;
  ipcmd->recv = ipcmd_recv_msq;
  ipcmd->flush = ipcmd_flush_msq;

  ipcmd->type = IPCMD_MSQ;

  return 1;
}